

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int htmlTokenizerTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  void *__ptr;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  char *filename_00;
  ulong uVar5;
  uint size;
  uint dataState;
  uint testNum;
  xmlTokenizerConfig config;
  char startTag [31];
  uint local_90;
  undefined4 local_8c;
  char *local_88;
  undefined1 local_7c [4];
  char *local_78;
  char *local_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined1 *local_60;
  undefined1 local_58 [40];
  
  nb_tests = nb_tests + 1;
  pcVar4 = temp_directory;
  filename_00 = filename;
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    htmlTokenizerTest_cold_2();
    iVar1 = xpathCommonTest(filename_00,pcVar4,0,1);
    return iVar1;
  }
  SAXdebug = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)SAXdebug == (FILE *)0x0) {
    htmlTokenizerTest_cold_1();
  }
  else {
    __stream = fopen64(filename,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"%s: failed to open\n",filename);
    }
    else {
      uVar5 = 0;
      local_88 = filename;
      local_78 = result;
      local_70 = __filename;
      iVar1 = __isoc99_fscanf(__stream,"%u %30s %u %u%*1[\n]",local_7c,local_58,&local_8c,&local_90)
      ;
      if (3 < iVar1) {
        uVar5 = 0;
        do {
          uVar5 = (ulong)((int)uVar5 + 1);
          fprintf((FILE *)SAXdebug,"%d\n");
          __ptr = (void *)(*_xmlMalloc)(local_90 + 1);
          sVar2 = fread(__ptr,1,(ulong)local_90,__stream);
          if (sVar2 != local_90) {
            pcVar4 = "%s:%d: unexpected eof\n";
            goto LAB_0010a238;
          }
          lVar3 = htmlCreatePushParserCtxt(&tokenizeHtmlSAXHandler,0,0,0,0,1);
          local_68 = local_8c;
          local_64 = 0;
          *(undefined4 **)(lVar3 + 0x1a8) = &local_68;
          *(undefined4 *)(lVar3 + 0x110) = 0x11;
          local_60 = local_58;
          htmlCtxtUseOptions(lVar3,options | 0x4000000);
          htmlParseChunk(lVar3,__ptr,local_90,1);
          htmlFreeParserCtxt(lVar3);
          (*_xmlFree)(__ptr);
          iVar1 = __isoc99_fscanf(__stream,"%u %30s %u %u%*1[\n]",local_7c,local_58,&local_8c,
                                  &local_90);
        } while (3 < iVar1);
      }
      iVar1 = feof(__stream);
      if (iVar1 != 0) {
        fclose(__stream);
        fclose((FILE *)SAXdebug);
        pcVar4 = local_70;
        iVar1 = compareFiles(local_70,local_78);
        if (iVar1 != 0) {
          fprintf(_stderr,"Got a difference for %s\n",local_88);
        }
        unlink(pcVar4);
        free(pcVar4);
        return (uint)(iVar1 != 0);
      }
      pcVar4 = "%s:%d: invalid format\n";
LAB_0010a238:
      fprintf(_stderr,pcVar4,local_88,uVar5);
    }
  }
  return -1;
}

Assistant:

static int
htmlTokenizerTest(const char *filename, const char *result,
                  const char *err ATTRIBUTE_UNUSED,
                  int options) {
    xmlTokenizerConfig config;
    char startTag[31];
    FILE *input;
    char *temp;
    unsigned testNum, dataState, size;
    int ret = 0, counter = 0;

    nb_tests++;
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }

    SAXdebug = fopen(temp, "wb");
    if (SAXdebug == NULL) {
        fprintf(stderr, "Failed to write to %s\n", temp);
	free(temp);
	return(-1);
    }

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr, "%s: failed to open\n", filename);
        return(-1);
    }

    while (fscanf(input, "%u %30s %u %u%*1[\n]",
                  &testNum, startTag, &dataState, &size) >= 4) {
        htmlParserCtxtPtr ctxt;
        char *data;

        fprintf(SAXdebug, "%d\n", counter++);

        data = xmlMalloc(size + 1);
        if (fread(data, 1, size, input) != size) {
            fprintf(stderr, "%s:%d: unexpected eof\n", filename, counter);
            return(-1);
        }

        ctxt = htmlCreatePushParserCtxt(&tokenizeHtmlSAXHandler, NULL, NULL, 0,
                                        NULL, XML_CHAR_ENCODING_UTF8);
        config.dataState = dataState;
        config.startTag = BAD_CAST startTag;
        config.inCharacters = 0;
        ctxt->_private = &config;
        /* Skip charset auto-detection */
        ctxt->instate = XML_PARSER_XML_DECL;
        htmlCtxtUseOptions(ctxt, options | HTML_PARSE_HTML5);
        htmlParseChunk(ctxt, data, size, 1);
        htmlFreeParserCtxt(ctxt);

        xmlFree(data);
    }
    if (!feof(input)) {
        fprintf(stderr, "%s:%d: invalid format\n", filename, counter);
        return(-1);
    }

    fclose(input);
    fclose(SAXdebug);

    if (compareFiles(temp, result)) {
        fprintf(stderr, "Got a difference for %s\n", filename);
        ret = 1;
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(ret);
}